

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

void __thiscall Highs::reportModelStats(Highs *this)

{
  value_type vVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  ostream *poVar9;
  long in_RDI;
  stringstream stats_line;
  HighsInt q_num_nz;
  HighsInt a_num_nz;
  bool non_continuous;
  string problem_type;
  HighsInt iCol;
  HighsInt num_semi_integer;
  HighsInt num_semi_continuous;
  HighsInt num_binary;
  HighsInt num_integer;
  HighsLogOptions *log_options;
  HighsHessian *hessian;
  HighsLp *lp;
  HighsSparseMatrix *in_stack_fffffffffffffd18;
  HighsLogOptions *pHVar10;
  uint local_234;
  string local_220 [32];
  stringstream local_200 [16];
  ostream local_1f0;
  uint local_74;
  uint local_70;
  undefined1 local_59;
  string local_58 [36];
  int local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  HighsLogOptions *local_20;
  int *local_18;
  uint *local_10;
  
  local_10 = (uint *)(in_RDI + 0x138);
  local_18 = (int *)(in_RDI + 0x4d0);
  local_20 = (HighsLogOptions *)(in_RDI + 0xe28);
  if ((**(byte **)(in_RDI + 0xe30) & 1) != 0) {
    local_24 = 0;
    local_28 = 0;
    local_2c = 0;
    local_30 = 0;
    for (local_34 = 0; iVar2 = local_34,
        sVar3 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::size
                          ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(local_10 + 0x5e))
        , iVar2 < (int)sVar3; local_34 = local_34 + 1) {
      pvVar4 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                         ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(local_10 + 0x5e),
                          (long)local_34);
      vVar1 = *pvVar4;
      if (vVar1 == kInteger) {
        local_24 = local_24 + 1;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_10 + 8),(long)local_34
                           );
        if ((*pvVar5 == 0.0) && (!NAN(*pvVar5))) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_10 + 0xe),
                              (long)local_34);
          if ((*pvVar5 == 1.0) && (!NAN(*pvVar5))) {
            local_28 = local_28 + 1;
          }
        }
      }
      else if (vVar1 == kSemiContinuous) {
        local_2c = local_2c + 1;
      }
      else if (vVar1 == kSemiInteger) {
        local_30 = local_30 + 1;
      }
    }
    std::__cxx11::string::string(local_58);
    local_59 = local_24 + local_2c + local_30 != 0;
    if (*local_18 == 0) {
      if ((bool)local_59) {
        std::__cxx11::string::operator=(local_58,"MIP ");
      }
      else {
        std::__cxx11::string::operator=(local_58,"LP  ");
      }
    }
    else if ((bool)local_59) {
      std::__cxx11::string::operator=(local_58,"MIQP");
    }
    else {
      std::__cxx11::string::operator=(local_58,"QP  ");
    }
    local_70 = HighsSparseMatrix::numNz(in_stack_fffffffffffffd18);
    if (*local_18 < 1) {
      local_234 = 0;
    }
    else {
      local_234 = HighsHessian::numNz((HighsHessian *)0x4d5c61);
    }
    pHVar10 = local_20;
    local_74 = local_234;
    if (*local_20->log_dev_level == 0) {
      std::__cxx11::stringstream::stringstream(local_200);
      std::operator<<(&local_1f0,local_58);
      lVar8 = std::__cxx11::string::length();
      if (lVar8 != 0) {
        poVar9 = std::operator<<(&local_1f0," ");
        std::operator<<(poVar9,(string *)(local_10 + 0x40));
      }
      poVar9 = std::operator<<(&local_1f0," has ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_10[1]);
      poVar9 = std::operator<<(poVar9," rows; ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,*local_10);
      std::operator<<(poVar9," cols");
      if (local_74 == 0) {
        poVar9 = std::operator<<(&local_1f0,"; ");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_70);
        std::operator<<(poVar9," nonzeros");
      }
      else {
        poVar9 = std::operator<<(&local_1f0,"; ");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_70);
        std::operator<<(poVar9," matrix nonzeros");
        poVar9 = std::operator<<(&local_1f0,"; ");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_74);
        std::operator<<(poVar9," Hessian nonzeros");
      }
      if (local_24 != 0) {
        poVar9 = std::operator<<(&local_1f0,"; ");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_24);
        poVar9 = std::operator<<(poVar9," integer variables (");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_28);
        std::operator<<(poVar9," binary)");
      }
      if (local_2c != 0) {
        poVar9 = std::operator<<(&local_1f0,"; ");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_2c);
        std::operator<<(poVar9," semi-continuous variables");
      }
      if (local_30 != 0) {
        poVar9 = std::operator<<(&local_1f0,"; ");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_30);
        std::operator<<(poVar9," semi-integer variables");
      }
      pHVar10 = local_20;
      std::__cxx11::stringstream::str();
      uVar6 = std::__cxx11::string::c_str();
      highsLogUser(pHVar10,kInfo,"%s\n",uVar6);
      std::__cxx11::string::~string(local_220);
      std::__cxx11::stringstream::~stringstream(local_200);
    }
    else {
      uVar6 = std::__cxx11::string::c_str();
      uVar7 = std::__cxx11::string::c_str();
      highsLogDev(pHVar10,kInfo,"%4s      : %s\n",uVar6,uVar7);
      highsLogDev(local_20,kInfo,"Rows      : %d\n",(ulong)local_10[1]);
      highsLogDev(local_20,kInfo,"Cols      : %d\n",(ulong)*local_10);
      if (local_74 == 0) {
        highsLogDev(local_20,kInfo,"Nonzeros  : %d\n",(ulong)local_70);
      }
      else {
        highsLogDev(local_20,kInfo,"Matrix Nz : %d\n",(ulong)local_70);
        highsLogDev(local_20,kInfo,"Hessian Nz: %d\n",(ulong)local_74);
      }
      if (local_24 != 0) {
        highsLogDev(local_20,kInfo,"Integer   : %d (%d binary)\n",(ulong)local_24,(ulong)local_28);
      }
      if (local_2c != 0) {
        highsLogDev(local_20,kInfo,"SemiConts : %d\n",(ulong)local_2c);
      }
      if (local_30 != 0) {
        highsLogDev(local_20,kInfo,"SemiInt   : %d\n",(ulong)local_30);
      }
    }
    std::__cxx11::string::~string(local_58);
  }
  return;
}

Assistant:

void Highs::reportModelStats() const {
  const HighsLp& lp = this->model_.lp_;
  const HighsHessian& hessian = this->model_.hessian_;
  const HighsLogOptions& log_options = this->options_.log_options;
  if (!*log_options.output_flag) return;
  HighsInt num_integer = 0;
  HighsInt num_binary = 0;
  HighsInt num_semi_continuous = 0;
  HighsInt num_semi_integer = 0;
  for (HighsInt iCol = 0; iCol < static_cast<HighsInt>(lp.integrality_.size());
       iCol++) {
    switch (lp.integrality_[iCol]) {
      case HighsVarType::kInteger:
        num_integer++;
        if (lp.col_lower_[iCol] == 0 && lp.col_upper_[iCol] == 1) num_binary++;
        break;
      case HighsVarType::kSemiContinuous:
        num_semi_continuous++;
        break;
      case HighsVarType::kSemiInteger:
        num_semi_integer++;
        break;
      default:
        break;
    }
  }
  std::string problem_type;
  const bool non_continuous =
      num_integer + num_semi_continuous + num_semi_integer;
  if (hessian.dim_) {
    if (non_continuous) {
      problem_type = "MIQP";
    } else {
      problem_type = "QP  ";
    }
  } else {
    if (non_continuous) {
      problem_type = "MIP ";
    } else {
      problem_type = "LP  ";
    }
  }
  const HighsInt a_num_nz = lp.a_matrix_.numNz();
  const HighsInt q_num_nz = hessian.dim_ > 0 ? hessian.numNz() : 0;
  if (*log_options.log_dev_level) {
    highsLogDev(log_options, HighsLogType::kInfo, "%4s      : %s\n",
                problem_type.c_str(), lp.model_name_.c_str());
    highsLogDev(log_options, HighsLogType::kInfo,
                "Rows      : %" HIGHSINT_FORMAT "\n", lp.num_row_);
    highsLogDev(log_options, HighsLogType::kInfo,
                "Cols      : %" HIGHSINT_FORMAT "\n", lp.num_col_);
    if (q_num_nz) {
      highsLogDev(log_options, HighsLogType::kInfo,
                  "Matrix Nz : %" HIGHSINT_FORMAT "\n", a_num_nz);
      highsLogDev(log_options, HighsLogType::kInfo,
                  "Hessian Nz: %" HIGHSINT_FORMAT "\n", q_num_nz);
    } else {
      highsLogDev(log_options, HighsLogType::kInfo,
                  "Nonzeros  : %" HIGHSINT_FORMAT "\n", a_num_nz);
    }
    if (num_integer)
      highsLogDev(log_options, HighsLogType::kInfo,
                  "Integer   : %" HIGHSINT_FORMAT " (%" HIGHSINT_FORMAT
                  " binary)\n",
                  num_integer, num_binary);
    if (num_semi_continuous)
      highsLogDev(log_options, HighsLogType::kInfo,
                  "SemiConts : %" HIGHSINT_FORMAT "\n", num_semi_continuous);
    if (num_semi_integer)
      highsLogDev(log_options, HighsLogType::kInfo,
                  "SemiInt   : %" HIGHSINT_FORMAT "\n", num_semi_integer);
  } else {
    std::stringstream stats_line;
    stats_line << problem_type;
    if (lp.model_name_.length()) stats_line << " " << lp.model_name_;
    stats_line << " has " << lp.num_row_ << " rows; " << lp.num_col_ << " cols";
    if (q_num_nz) {
      stats_line << "; " << a_num_nz << " matrix nonzeros";
      stats_line << "; " << q_num_nz << " Hessian nonzeros";
    } else {
      stats_line << "; " << a_num_nz << " nonzeros";
    }
    if (num_integer)
      stats_line << "; " << num_integer << " integer variables (" << num_binary
                 << " binary)";
    if (num_semi_continuous)
      stats_line << "; " << num_semi_continuous << " semi-continuous variables";
    if (num_semi_integer)
      stats_line << "; " << num_semi_integer << " semi-integer variables";
    highsLogUser(log_options, HighsLogType::kInfo, "%s\n",
                 stats_line.str().c_str());
  }
}